

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatfile.cpp
# Opt level: O3

size_t __thiscall
FlatFileSeq::Allocate(FlatFileSeq *this,FlatFilePos *pos,size_t add_size,bool *out_of_space)

{
  ulong uVar1;
  ulong uVar2;
  string_view source_file;
  bool bVar3;
  FILE *__stream;
  Logger *pLVar4;
  size_t additional_bytes;
  ulong uVar5;
  int *args_2;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  size_t new_size;
  string log_msg;
  long local_e8 [14];
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *out_of_space = false;
  uVar5 = (ulong)pos->nPos;
  uVar1 = this->m_chunk_size;
  args_2 = (int *)(uVar5 + uVar1);
  additional_bytes = 0;
  uVar2 = ((long)args_2 + (add_size - 1)) / uVar1;
  if ((uint)(((uVar5 + uVar1) - 1) / uVar1) < (uint)uVar2) {
    local_e8[0] = (uVar2 & 0xffffffff) * uVar1;
    additional_bytes = local_e8[0] - uVar5;
    bVar3 = CheckDiskSpace(&this->m_dir,additional_bytes);
    if (bVar3) {
      __stream = (FILE *)Open(this,pos,false);
      if (__stream != (FILE *)0x0) {
        pLVar4 = LogInstance();
        bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar4,VALIDATION,Debug);
        if (bVar3) {
          pLVar4 = LogInstance();
          bVar3 = BCLog::Logger::Enabled(pLVar4);
          if (bVar3) {
            local_58._M_string_length = 0;
            local_58.field_2._M_local_buf[0] = '\0';
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            tinyformat::format<unsigned_long,char_const*,int>
                      (&local_78,(tinyformat *)"Pre-allocating up to position 0x%x in %s%05u.dat\n",
                       (char *)local_e8,(unsigned_long *)&this->m_prefix,(char **)pos,args_2);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&local_58,&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            pLVar4 = LogInstance();
            local_78._M_dataplus._M_p = (pointer)0x55;
            local_78._M_string_length = 0x840dc2;
            source_file._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/flatfile.cpp"
            ;
            source_file._M_len = 0x55;
            str._M_str = local_58._M_dataplus._M_p;
            str._M_len = local_58._M_string_length;
            logging_function._M_str = "Allocate";
            logging_function._M_len = 8;
            BCLog::Logger::LogPrintStr
                      (pLVar4,str,logging_function,source_file,0x45,VALIDATION,Debug);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,
                              CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                       local_58.field_2._M_local_buf[0]) + 1);
            }
          }
        }
        AllocateFileRange((FILE *)__stream,pos->nPos,(uint)additional_bytes);
        fclose(__stream);
        goto LAB_0046710b;
      }
    }
    else {
      *out_of_space = true;
    }
    additional_bytes = 0;
  }
LAB_0046710b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return additional_bytes;
  }
  __stack_chk_fail();
}

Assistant:

size_t FlatFileSeq::Allocate(const FlatFilePos& pos, size_t add_size, bool& out_of_space) const
{
    out_of_space = false;

    unsigned int n_old_chunks = (pos.nPos + m_chunk_size - 1) / m_chunk_size;
    unsigned int n_new_chunks = (pos.nPos + add_size + m_chunk_size - 1) / m_chunk_size;
    if (n_new_chunks > n_old_chunks) {
        size_t old_size = pos.nPos;
        size_t new_size = n_new_chunks * m_chunk_size;
        size_t inc_size = new_size - old_size;

        if (CheckDiskSpace(m_dir, inc_size)) {
            FILE *file = Open(pos);
            if (file) {
                LogDebug(BCLog::VALIDATION, "Pre-allocating up to position 0x%x in %s%05u.dat\n", new_size, m_prefix, pos.nFile);
                AllocateFileRange(file, pos.nPos, inc_size);
                fclose(file);
                return inc_size;
            }
        } else {
            out_of_space = true;
        }
    }
    return 0;
}